

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECPrivateKey.cpp
# Opt level: O2

ByteString * __thiscall
ECPrivateKey::serialise(ByteString *__return_storage_ptr__,ECPrivateKey *this)

{
  ByteString local_60;
  ByteString local_38;
  
  ByteString::serialise(&local_38,&this->ec);
  ByteString::serialise(&local_60,&this->d);
  operator+(__return_storage_ptr__,&local_38,&local_60);
  ByteString::~ByteString(&local_60);
  ByteString::~ByteString(&local_38);
  return __return_storage_ptr__;
}

Assistant:

ByteString ECPrivateKey::serialise() const
{
	return ec.serialise() +
	       d.serialise();
}